

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressor.cpp
# Opt level: O1

half __thiscall
Imf_3_2::DwaCompressor::LossyDctEncoderBase::quantize
          (LossyDctEncoderBase *this,half src,float errorTolerance)

{
  ushort *puVar1;
  int iVar2;
  
  if ((uint)countSetBits::numBitsSet[(byte)(src._h >> 8)] +
      (uint)countSetBits::numBitsSet[src._h & 0xff] != 0) {
    puVar1 = (ushort *)(&closestData + (ulong)*(uint *)(closestDataOffset + (ulong)src._h * 4) * 2);
    iVar2 = (uint)countSetBits::numBitsSet[src._h & 0xff] +
            (uint)countSetBits::numBitsSet[(byte)(src._h >> 8)] + 1;
    do {
      if (ABS(*(float *)(_imath_half_to_float_table + (ulong)*puVar1 * 4) -
              *(float *)(_imath_half_to_float_table + (ulong)src._h * 4)) < errorTolerance) {
        return (half)*puVar1;
      }
      puVar1 = puVar1 + 1;
      iVar2 = iVar2 + -1;
    } while (1 < iVar2);
  }
  return (half)src._h;
}

Assistant:

half
DwaCompressor::LossyDctEncoderBase::quantize (half src, float errorTolerance)
{
    half                  tmp;
    float                 srcFloat   = (float) src;
    int                   numSetBits = countSetBits (src.bits ());
    const unsigned short* closest =
        closestData + closestDataOffset[src.bits ()];

    for (int targetNumSetBits = numSetBits - 1; targetNumSetBits >= 0;
         --targetNumSetBits)
    {
        tmp.setBits (*closest);

        if (fabs ((float) tmp - srcFloat) < errorTolerance) return tmp;

        closest++;
    }

    return src;
}